

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmLibrary.cpp
# Opt level: O3

Var Js::WasmLibrary::WasmLazyTrapCallback(RecyclableObject *callee,CallInfo param_2,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *this;
  AsmJsFunctionInfo *pAVar4;
  
  if (callee == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                ,0x11,"(asmFunction)","asmFunction");
    if (!bVar2) goto LAB_00d85c3f;
    *puVar3 = 0;
  }
  scriptContext =
       (((((callee->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
       ptr;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WasmLibrary.cpp"
                                ,0x13,"(scriptContext)","scriptContext");
    if (!bVar2) {
LAB_00d85c3f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)callee);
  pAVar4 = FunctionBody::GetAsmJsFunctionInfo(this);
  JavascriptExceptionOperators::Throw((pAVar4->mLazyError).ptr,scriptContext);
}

Assistant:

Var WasmLibrary::WasmLazyTrapCallback(RecyclableObject *callee, CallInfo, ...)
    {
        WasmScriptFunction* asmFunction = static_cast<WasmScriptFunction*>(callee);
        Assert(asmFunction);
        ScriptContext * scriptContext = asmFunction->GetScriptContext();
        Assert(scriptContext);
        auto error = asmFunction->GetFunctionBody()->GetAsmJsFunctionInfo()->GetLazyError();
        JavascriptExceptionOperators::Throw(error, scriptContext);
    }